

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

void __thiscall
BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::Timer
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *this,string *prefix,
          string *end_msg,LogFlags log_category,bool msg_on_completion)

{
  long lVar1;
  byte bVar2;
  string *in_RCX;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *in_RDX;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RSI;
  long in_RDI;
  optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  byte in_R8B;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_R8B & 1;
  std::
  optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ::optional((optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
              *)in_stack_ffffffffffffff68);
  this_00 = (optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
             *)(in_RDI + 0x10);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar2,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x30);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar2,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0);
  *(string **)(in_RDI + 0x50) = in_RCX;
  *(byte *)(in_RDI + 0x58) = bVar2 & 1;
  tinyformat::format<std::__cxx11::string>(in_stack_ffffffffffffff98,args);
  Log(in_RDX,in_RCX);
  std::__cxx11::string::~string(in_stack_ffffffffffffff68);
  std::chrono::_V2::steady_clock::now();
  std::
  optional<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
  ::operator=(this_00,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Timer(
        std::string prefix,
        std::string end_msg,
        BCLog::LogFlags log_category = BCLog::LogFlags::ALL,
        bool msg_on_completion = true)
        : m_prefix(std::move(prefix)),
          m_title(std::move(end_msg)),
          m_log_category(log_category),
          m_message_on_completion(msg_on_completion)
    {
        this->Log(strprintf("%s started", m_title));
        m_start_t = std::chrono::steady_clock::now();
    }